

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_print(FILE *fp,float64 ***den,uint32 ***den_idx,gauden_t *g,uint32 *inv,uint32 n_inv)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (inv == (uint32 *)0x0) {
    for (uVar3 = 0; uVar3 < g->n_mgau; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < g->n_feat; uVar2 = uVar2 + 1) {
        for (uVar4 = 0; uVar4 < g->n_top; uVar4 = uVar4 + 1) {
          fprintf((FILE *)fp,"(%1u %1u %1u)= [%3u] %.2e\n",den[uVar3][uVar2][uVar4],
                  uVar3 & 0xffffffff,uVar2 & 0xffffffff,uVar4 & 0xffffffff,
                  (ulong)den_idx[uVar3][uVar2][uVar4]);
        }
      }
    }
  }
  else {
    for (uVar3 = 0; (uint32)uVar3 != n_inv; uVar3 = (ulong)((uint32)uVar3 + 1)) {
      uVar1 = inv[uVar3];
      if (g->n_mgau <= uVar1) {
        __assert_fail("i < g->n_mgau",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x58a,
                      "void gauden_print(FILE *, float64 ***, uint32 ***, gauden_t *, uint32 *, uint32)"
                     );
      }
      for (uVar2 = 0; uVar2 < g->n_feat; uVar2 = uVar2 + 1) {
        for (uVar4 = 0; uVar4 < g->n_top; uVar4 = uVar4 + 1) {
          fprintf((FILE *)fp,"(%1u %1u %1u)= [%3u] %.2e\n",den[uVar1][uVar2][uVar4],(ulong)uVar1,
                  uVar2 & 0xffffffff,uVar4 & 0xffffffff,(ulong)den_idx[uVar1][uVar2][uVar4]);
        }
      }
    }
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

void
gauden_print(FILE *fp,
	     float64 ***den,
	     uint32 ***den_idx,
	     gauden_t *g,
	     uint32 *inv,
	     uint32 n_inv)
{
    uint32 i, ii, j, k;

    if (inv == NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_top; k++) {
		    fprintf(fp, "(%1u %1u %1u)= [%3u] %.2e\n",
			    i, j, k, den_idx[i][j][k], den[i][j][k]);
		}
	    }
	}
    }
    else {
	for (ii = 0; ii < n_inv; ii++) {

	    i = inv[ii];
	    assert(i < g->n_mgau);

	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_top; k++) {
		    fprintf(fp, "(%1u %1u %1u)= [%3u] %.2e\n",
			    i, j, k, den_idx[i][j][k], den[i][j][k]);
		}
	    }
	}
    }

    fflush(fp);
}